

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O0

bool __thiscall
M7Getter::ParseRecord
          (M7Getter *this,char *buffer,char **p_tld,size_t *tld_length,bool *has_ds,
          uint32_t *algo_code)

{
  char cVar1;
  bool bVar2;
  int local_50;
  int nb_dots;
  int x;
  size_t i;
  bool ret;
  uint32_t *algo_code_local;
  bool *has_ds_local;
  size_t *tld_length_local;
  char **p_tld_local;
  char *buffer_local;
  M7Getter *this_local;
  
  i._7_1_ = true;
  local_50 = 0;
  *p_tld = buffer;
  *tld_length = 0;
  *has_ds = false;
  *algo_code = 0;
  for (_nb_dots = 0; cVar1 = buffer[_nb_dots], cVar1 != '\0'; _nb_dots = _nb_dots + 1) {
    if ((((cVar1 < 'a') || ('z' < cVar1)) && ((cVar1 < 'A' || ('Z' < cVar1)))) &&
       (((cVar1 < '0' || ('9' < cVar1)) && (cVar1 != '-')))) {
      if (cVar1 != '.') break;
      local_50 = local_50 + 1;
    }
  }
  if ((_nb_dots < 3) || (1 < local_50)) {
    i._7_1_ = false;
  }
  else {
    *tld_length = _nb_dots - 1;
    if ((buffer[_nb_dots] == ' ') || (buffer[_nb_dots] == '\t')) {
      do {
        _nb_dots = _nb_dots + 1;
        bVar2 = true;
        if (buffer[_nb_dots] != ' ') {
          bVar2 = buffer[_nb_dots] == '\t';
        }
      } while (bVar2);
    }
    else {
      i._7_1_ = false;
    }
    if ((buffer[_nb_dots] < '0') || ('9' < buffer[_nb_dots])) {
      i._7_1_ = false;
    }
    else {
      do {
        _nb_dots = _nb_dots + 1;
        bVar2 = false;
        if ('/' < buffer[_nb_dots]) {
          bVar2 = buffer[_nb_dots] < ':';
        }
      } while (bVar2);
    }
    if ((buffer[_nb_dots] == ' ') || (buffer[_nb_dots] == '\t')) {
      do {
        _nb_dots = _nb_dots + 1;
        bVar2 = true;
        if (buffer[_nb_dots] != ' ') {
          bVar2 = buffer[_nb_dots] == '\t';
        }
      } while (bVar2);
    }
    else {
      i._7_1_ = false;
    }
    if (((buffer[_nb_dots] == 'i') || (buffer[_nb_dots] == 'I')) &&
       ((buffer[_nb_dots + 1] == 'n' || (buffer[_nb_dots + 1] == 'N')))) {
      _nb_dots = _nb_dots + 2;
    }
    else {
      i._7_1_ = false;
    }
    if ((buffer[_nb_dots] == ' ') || (buffer[_nb_dots] == '\t')) {
      do {
        _nb_dots = _nb_dots + 1;
        bVar2 = true;
        if (buffer[_nb_dots] != ' ') {
          bVar2 = buffer[_nb_dots] == '\t';
        }
      } while (bVar2);
    }
    else {
      i._7_1_ = false;
    }
    if ((((buffer[_nb_dots] == 'd') || (buffer[_nb_dots] == 'D')) &&
        ((buffer[_nb_dots + 1] == 's' || (buffer[_nb_dots + 1] == 'S')))) &&
       ((buffer[_nb_dots + 2] == ' ' || (buffer[_nb_dots + 2] == '\t')))) {
      *has_ds = true;
      _nb_dots = _nb_dots + 2;
      do {
        _nb_dots = _nb_dots + 1;
        bVar2 = true;
        if (buffer[_nb_dots] != ' ') {
          bVar2 = buffer[_nb_dots] == '\t';
        }
      } while (bVar2);
      if ((buffer[_nb_dots] < '0') || ('9' < buffer[_nb_dots])) {
        i._7_1_ = false;
      }
      else {
        do {
          _nb_dots = _nb_dots + 1;
          bVar2 = false;
          if ('/' < buffer[_nb_dots]) {
            bVar2 = buffer[_nb_dots] < ':';
          }
        } while (bVar2);
      }
      if ((buffer[_nb_dots] == ' ') || (buffer[_nb_dots] == '\t')) {
        do {
          _nb_dots = _nb_dots + 1;
          bVar2 = true;
          if (buffer[_nb_dots] != ' ') {
            bVar2 = buffer[_nb_dots] == '\t';
          }
        } while (bVar2);
      }
      else {
        i._7_1_ = false;
      }
      if ((buffer[_nb_dots] < '0') || ('9' < buffer[_nb_dots])) {
        i._7_1_ = false;
      }
      else {
        while( true ) {
          bVar2 = false;
          if ('/' < buffer[_nb_dots]) {
            bVar2 = buffer[_nb_dots] < ':';
          }
          if (!bVar2) {
            return i._7_1_;
          }
          if (0x1ffffff < *algo_code) break;
          *algo_code = *algo_code * 10;
          *algo_code = buffer[_nb_dots] + -0x30 + *algo_code;
          _nb_dots = _nb_dots + 1;
        }
        i._7_1_ = false;
      }
    }
  }
  return i._7_1_;
}

Assistant:

bool M7Getter::ParseRecord(char * buffer, char ** p_tld, size_t * tld_length, bool * has_ds, uint32_t* algo_code)
{
    bool ret = true;
    size_t i = 0;
    int x;
    int nb_dots = 0;


    *p_tld = buffer;
    *tld_length = 0;
    *has_ds = false;
    *algo_code = 0;

    for (i = 0; (x = buffer[i]) != 0; i++)
    {
        if ((x >= 'a' && x <= 'z') || (x >= 'A' && x <= 'Z') ||
            (x >= '0' && x <= '9') || (x == '-'))
        {
            continue;
        }
        else if (x == '.')
        {
            nb_dots++;
        }
        else
        {
            break;
        }
    }

    if (i <= 2 || nb_dots > 1)
    {
        ret = false;
    }
    else
    {
        *tld_length = i - 1;

        /* skip spaces */
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* skip TTL */
        if (buffer[i] < '0' || buffer[i] > '9')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] >= '0' && buffer[i] <= '9');
        }
        /* skip more spaces */
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* skip CLASS */
        if ((buffer[i] == 'i' || buffer[i] == 'I') &&
            (buffer[i+1] == 'n' || buffer[i+1] == 'N'))
        {
            i += 2;
        }
        else
        {
            ret = false;
        }
        /* skip more space*/
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* check ds_bit */
        if ((buffer[i] == 'd' || buffer[i] == 'D') &&
            (buffer[i + 1] == 's' || buffer[i + 1] == 'S') &&
            (buffer[i + 2] == ' ' || buffer[i + 2] == '\t'))
        {
            *has_ds = true;
            i += 2;
            /* skip space until next number */
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');

            /* skip digits (key ID) */
            if (buffer[i] < '0' || buffer[i] > '9')
            {
                ret = false;
            }
            else
            {
                do
                {
                    i++;
                } while (buffer[i] >= '0' && buffer[i] <= '9');
            }
            /* Skip more spaces */
            if (buffer[i] != ' ' && buffer[i] != '\t')
            {
                ret = false;
            }
            else
            {
                do
                {
                    i++;
                } while (buffer[i] == ' ' || buffer[i] == '\t');
            }
            /* Compute algorithm number */
            if (buffer[i] < '0' || buffer[i] > '9')
            {
                ret = false;
            }
            else while (buffer[i] >= '0' && buffer[i] <= '9')
            {
                if (*algo_code > 0x1FFFFFF) {
                    ret = false;
                    break;
                }
                *algo_code *= 10;
                *algo_code += (uint32_t)(buffer[i] - '0');
                i++;
            }
        }
    }

    return ret;
}